

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

WaitForLineResult
cmSystemTools::WaitForLine
          (uv_loop_t *loop,uv_stream_t *outPipe,uv_stream_t *errPipe,string *line,cmDuration timeout
          ,vector<char,_std::allocator<char>_> *out,vector<char,_std::allocator<char>_> *err)

{
  char cVar1;
  char *pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  uint uVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  const_iterator cVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  cmProcessOutput processOutput;
  bool timedOut;
  rep local_138;
  uv_timer_ptr timer;
  string strdata;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> errHandle;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> outHandle;
  ReadData outData;
  ReadData errData;
  string local_70;
  string local_50;
  
  line->_M_string_length = 0;
  *(line->_M_dataplus)._M_p = '\0';
  pcVar10 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  pcVar12 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  cmProcessOutput::cmProcessOutput(&processOutput,Auto,0x400);
  strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
  strdata._M_string_length = 0;
  strdata.field_2._M_local_buf[0] = '\0';
  uVar7 = (ulong)(timeout.__r * 1000.0);
  local_138 = timeout.__r;
  do {
    pcVar2 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    lVar8 = -(long)pcVar10;
    for (pcVar11 = pcVar10; pcVar10 = pcVar2, pcVar11 != pcVar2; pcVar11 = pcVar11 + 1) {
      cVar1 = *pcVar11;
      if (cVar1 == '\r') {
        pcVar10 = pcVar11;
        if (pcVar11 + 1 == pcVar2) break;
      }
      else if ((cVar1 == '\0') || (cVar1 == '\n')) {
        cVar9._M_current =
             (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start;
        if ((1 < (ulong)-(long)(cVar9._M_current + lVar8)) || (pcVar11 != cVar9._M_current)) {
          std::__cxx11::string::append((char *)line,(ulong)cVar9._M_current);
          cVar9._M_current =
               (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::vector<char,_std::allocator<char>_>::erase(out,cVar9,(const_iterator)(pcVar11 + 1));
        local_138._0_4_ = STDOUT;
        goto LAB_0011583a;
      }
      lVar8 = lVar8 + -1;
    }
    pcVar2 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    lVar8 = -(long)pcVar12;
    for (pcVar11 = pcVar12; pcVar12 = pcVar2, pcVar11 != pcVar2; pcVar11 = pcVar11 + 1) {
      cVar1 = *pcVar11;
      if (cVar1 == '\r') {
        pcVar12 = pcVar11;
        if (pcVar11 + 1 == pcVar2) break;
      }
      else if ((cVar1 == '\0') || (cVar1 == '\n')) {
        cVar9._M_current =
             (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start;
        if ((1 < (ulong)-(long)(cVar9._M_current + lVar8)) || (pcVar11 != cVar9._M_current)) {
          std::__cxx11::string::append((char *)line,(ulong)cVar9._M_current);
          cVar9._M_current =
               (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::vector<char,_std::allocator<char>_>::erase(err,cVar9,(const_iterator)(pcVar11 + 1));
        local_138._0_4_ = STDERR;
        goto LAB_0011583a;
      }
      lVar8 = lVar8 + -1;
    }
    outData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_2_ = 0;
    outData._26_8_ = 0;
    outData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    outData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_2_ = 0;
    outData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish._2_6_ = 0;
    WaitForLine::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&outHandle,outPipe,&outData);
    errData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_2_ = 0;
    errData._26_8_ = 0;
    errData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    errData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_2_ = 0;
    errData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish._2_6_ = 0;
    WaitForLine::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&errHandle,errPipe,&errData);
    timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
    super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
    super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cm::uv_timer_ptr::init(&timer,(EVP_PKEY_CTX *)loop);
    cm::uv_timer_ptr::start
              (&timer,WaitForLine::anon_class_1_0_00000001::__invoke,
               (long)(timeout.__r * 1000.0 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7,0)
    ;
    uv_run(loop,UV_RUN_ONCE);
    if (outData.Read == true) {
      cmProcessOutput::DecodeText
                (&processOutput,
                 outData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 CONCAT62(outData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish._2_6_,
                          outData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish._0_2_) -
                 (long)outData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,&strdata,1);
      pcVar3 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar4 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      cm::
      append<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (out,&strdata);
      pcVar10 = pcVar4 + ((long)(out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                super__Vector_impl_data._M_start - (long)pcVar3);
LAB_0011559f:
      if (outData.Finished == false) {
        uv_read_stop(outPipe);
      }
      bVar6 = true;
      if (errData.Finished == false) {
        uv_read_stop(errPipe);
      }
    }
    else {
      if (errData.Read == true) {
        cmProcessOutput::DecodeText
                  (&processOutput,
                   errData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   CONCAT62(errData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish._2_6_,
                            errData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_2_) -
                   (long)errData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,&strdata,2);
        pcVar3 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar4 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        cm::
        append<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (err,&strdata);
        pcVar12 = pcVar4 + ((long)(err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                  super__Vector_impl_data._M_start - (long)pcVar3);
        goto LAB_0011559f;
      }
      if ((outData.Finished != true) || (errData.Finished != true)) goto LAB_0011559f;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      cmProcessOutput::DecodeText(&processOutput,&local_50,&strdata,1);
      std::__cxx11::string::~string((string *)&local_50);
      if (strdata._M_string_length != 0) {
        pcVar3 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar4 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        cm::
        append<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (out,&strdata);
        pcVar10 = pcVar4 + ((long)(out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                  super__Vector_impl_data._M_start - (long)pcVar3);
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      cmProcessOutput::DecodeText(&processOutput,&local_70,&strdata,2);
      std::__cxx11::string::~string((string *)&local_70);
      if (strdata._M_string_length != 0) {
        pcVar3 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar4 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        cm::
        append<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (err,&strdata);
        pcVar12 = pcVar4 + ((long)(err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                  super__Vector_impl_data._M_start - (long)pcVar3);
      }
      pcVar3 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pcVar3 == (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish) {
        pcVar3 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pcVar3 != (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
          std::__cxx11::string::append((char *)line,(ulong)pcVar3);
          std::vector<char,_std::allocator<char>_>::erase
                    (err,(const_iterator)
                         (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_start,
                     (const_iterator)
                     (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
          uVar5 = 2;
          goto LAB_001154ed;
        }
        bVar6 = false;
        local_138 = 0.0;
      }
      else {
        std::__cxx11::string::append((char *)line,(ulong)pcVar3);
        std::vector<char,_std::allocator<char>_>::erase
                  (out,(const_iterator)
                       (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_start,
                   (const_iterator)
                   (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish);
        uVar5 = 1;
LAB_001154ed:
        bVar6 = false;
        local_138 = (rep)(ulong)uVar5;
      }
    }
    cm::uv_handle_ptr_base_<uv_timer_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_timer_s> *)&timer);
    std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
              (&errHandle);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&errData.Buffer.super__Vector_base<char,_std::allocator<char>_>);
    std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
              (&outHandle);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&outData.Buffer.super__Vector_base<char,_std::allocator<char>_>);
    if (!bVar6) {
LAB_0011583a:
      std::__cxx11::string::~string((string *)&strdata);
      return local_138._0_4_;
    }
  } while( true );
}

Assistant:

cmSystemTools::WaitForLineResult cmSystemTools::WaitForLine(
  uv_loop_t* loop, uv_stream_t* outPipe, uv_stream_t* errPipe,
  std::string& line, cmDuration timeout, std::vector<char>& out,
  std::vector<char>& err)
{
  line.clear();
  auto outiter = out.begin();
  auto erriter = err.begin();
  cmProcessOutput processOutput;
  std::string strdata;
  while (true) {
    // Check for a newline in stdout.
    for (; outiter != out.end(); ++outiter) {
      if ((*outiter == '\r') && ((outiter + 1) == out.end())) {
        break;
      }
      if (*outiter == '\n' || *outiter == '\0') {
        std::vector<char>::size_type length = outiter - out.begin();
        if (length > 1 && *(outiter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(out.data(), length);
        }
        out.erase(out.begin(), outiter + 1);
        return WaitForLineResult::STDOUT;
      }
    }

    // Check for a newline in stderr.
    for (; erriter != err.end(); ++erriter) {
      if ((*erriter == '\r') && ((erriter + 1) == err.end())) {
        break;
      }
      if (*erriter == '\n' || *erriter == '\0') {
        std::vector<char>::size_type length = erriter - err.begin();
        if (length > 1 && *(erriter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(err.data(), length);
        }
        err.erase(err.begin(), erriter + 1);
        return WaitForLineResult::STDERR;
      }
    }

    // No newlines found.  Wait for more data from the process.
    struct ReadData
    {
      uv_stream_t* Stream;
      std::vector<char> Buffer;
      bool Read = false;
      bool Finished = false;
    };
    auto startRead =
      [](uv_stream_t* stream,
         ReadData& data) -> std::unique_ptr<cmUVStreamReadHandle> {
      data.Stream = stream;
      return cmUVStreamRead(
        stream,
        [&data](std::vector<char> buf) {
          data.Buffer = std::move(buf);
          data.Read = true;
          uv_read_stop(data.Stream);
        },
        [&data]() { data.Finished = true; });
    };
    ReadData outData;
    auto outHandle = startRead(outPipe, outData);
    ReadData errData;
    auto errHandle = startRead(errPipe, errData);

    cm::uv_timer_ptr timer;
    bool timedOut = false;
    timer.init(*loop, &timedOut);
    timer.start(
      [](uv_timer_t* handle) {
        auto* timedOutPtr = static_cast<bool*>(handle->data);
        *timedOutPtr = true;
      },
      static_cast<uint64_t>(timeout.count() * 1000.0), 0);

    uv_run(loop, UV_RUN_ONCE);
    if (timedOut) {
      // Timeout has been exceeded.
      return WaitForLineResult::Timeout;
    }
    if (outData.Read) {
      processOutput.DecodeText(outData.Buffer.data(), outData.Buffer.size(),
                               strdata, 1);
      // Append to the stdout buffer.
      std::vector<char>::size_type size = out.size();
      cm::append(out, strdata);
      outiter = out.begin() + size;
    } else if (errData.Read) {
      processOutput.DecodeText(errData.Buffer.data(), errData.Buffer.size(),
                               strdata, 2);
      // Append to the stderr buffer.
      std::vector<char>::size_type size = err.size();
      cm::append(err, strdata);
      erriter = err.begin() + size;
    } else if (outData.Finished && errData.Finished) {
      // Both stdout and stderr pipes have broken.  Return leftover data.
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = out.size();
        cm::append(out, strdata);
        outiter = out.begin() + size;
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = err.size();
        cm::append(err, strdata);
        erriter = err.begin() + size;
      }
      if (!out.empty()) {
        line.append(out.data(), outiter - out.begin());
        out.erase(out.begin(), out.end());
        return WaitForLineResult::STDOUT;
      }
      if (!err.empty()) {
        line.append(err.data(), erriter - err.begin());
        err.erase(err.begin(), err.end());
        return WaitForLineResult::STDERR;
      }
      return WaitForLineResult::None;
    }
    if (!outData.Finished) {
      uv_read_stop(outPipe);
    }
    if (!errData.Finished) {
      uv_read_stop(errPipe);
    }
  }
}